

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

void __thiscall HEkkDual::chooseColumnSlice(HEkkDual *this,HVector *row_ep)

{
  HEkkDualRow *this_00;
  __atomic_base<int> _Var1;
  element_type *peVar2;
  pointer pHVar3;
  bool bVar4;
  char *pcVar5;
  uint uVar6;
  HighsInt HVar7;
  uint uVar8;
  HighsSplitDeque *pHVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t uVar12;
  int result_count;
  uint end;
  HighsSimplexAnalysis *this_01;
  HighsInt i;
  long lVar13;
  HighsInt i_1;
  long lVar14;
  double dVar15;
  bool use_row_price_w_switch;
  bool use_col_price;
  HVector *row_ep_local;
  TaskGroup tg;
  undefined1 local_68 [24];
  bool *local_50;
  anon_class_24_4_3f80b2e7_for_functor local_48;
  
  if (this->rebuild_reason == 0) {
    row_ep_local = row_ep;
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2e,0);
    this_00 = &this->dualRow;
    HEkkDualRow::clear(this_00);
    (this->dualRow).workDelta = this->delta_primal;
    HEkkDualRow::createFreemove(this_00,row_ep);
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2e,0);
    HEkk::choosePriceTechnique
              (this->ekk_instance_,(this->ekk_instance_->info_).price_strategy,
               (double)row_ep->count * this->inv_solver_num_row,&use_col_price,
               &use_row_price_w_switch);
    this_01 = this->analysis;
    if (this_01->analyse_simplex_summary_data == true) {
      if (use_col_price == true) {
        HighsSimplexAnalysis::operationRecordBefore(this_01,5,row_ep_local->count,0.0);
        this_01 = this->analysis;
        this_01->num_col_price = this_01->num_col_price + 1;
      }
      else {
        HighsSimplexAnalysis::operationRecordBefore
                  (this_01,5,row_ep_local->count,(this->ekk_instance_->info_).row_ep_density);
        this_01 = this->analysis;
        if (use_row_price_w_switch == true) {
          this_01->num_row_price_with_switch = this_01->num_row_price_with_switch + 1;
        }
        else {
          this_01->num_row_price = this_01->num_row_price + 1;
        }
      }
    }
    HighsSimplexAnalysis::simplexTimerStart(this_01,0x2f,0);
    local_68._0_8_ = this;
    local_68._8_8_ = &row_ep_local;
    pHVar9 = HighsTaskExecutor::getThisWorkerDeque();
    uVar8 = (pHVar9->ownerData).head;
    uVar10 = (ulong)uVar8;
    if (uVar10 < 0x2000) {
      uVar12 = (uint32_t)(uVar10 + 1);
      (pHVar9->ownerData).head = uVar12;
      (pHVar9->taskArray)._M_elems[uVar10].metadata.stealer.super___atomic_base<unsigned_long>._M_i
           = 0;
      *(undefined ***)(pHVar9->taskArray)._M_elems[uVar10].taskData = &PTR_operator___00433458;
      pcVar5 = (pHVar9->taskArray)._M_elems[uVar10].taskData;
      *(undefined8 *)(pcVar5 + 8) = local_68._0_8_;
      *(undefined8 *)(pcVar5 + 0x10) = local_68._8_8_;
      if ((pHVar9->ownerData).allStolenCopy == true) {
        (pHVar9->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
             uVar10 << 0x20 | uVar10 + 1;
        (pHVar9->stealerData).allStolen._M_base._M_i = false;
        (pHVar9->ownerData).splitCopy = uVar12;
        (pHVar9->ownerData).allStolenCopy = false;
        if (((pHVar9->splitRequest)._M_base._M_i & 1U) != 0) {
          (pHVar9->splitRequest)._M_base._M_i = false;
        }
        peVar2 = (pHVar9->ownerData).workerBunk.
                 super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        LOCK();
        _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
        (peVar2->haveJobs).super___atomic_base<int>._M_i =
             (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        if (_Var1._M_i < (pHVar9->ownerData).numWorkers + -1) {
          HighsSplitDeque::WorkerBunk::publishWork
                    ((pHVar9->ownerData).workerBunk.
                     super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,pHVar9);
        }
      }
      else {
        HighsSplitDeque::growShared(pHVar9);
      }
    }
    else {
      if (((pHVar9->ownerData).splitCopy < 0x2000) && ((pHVar9->ownerData).allStolenCopy == false))
      {
        HighsSplitDeque::growShared(pHVar9);
        uVar8 = (pHVar9->ownerData).head;
      }
      (pHVar9->ownerData).head = uVar8 + 1;
      HighsTask::
      Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/simplex/HEkkDual.cpp:1824:26)>
      ::anon_class_16_2_51b7012b_for_functor::operator()
                ((anon_class_16_2_51b7012b_for_functor *)local_68);
    }
    uVar8 = this->slice_num;
    local_50 = &use_row_price_w_switch;
    local_68._8_8_ = &use_col_price;
    local_68._16_8_ = &row_ep_local;
    if ((int)uVar8 < 2) {
      local_68._0_8_ = this;
      chooseColumnSlice::anon_class_32_4_b1b9b1f6::operator()
                ((anon_class_32_4_b1b9b1f6 *)local_68,0,uVar8);
    }
    else {
      local_68._0_8_ = this;
      tg.workerDeque = HighsTaskExecutor::getThisWorkerDeque();
      tg.dequeHead = ((tg.workerDeque)->ownerData).head;
      do {
        pHVar9 = tg.workerDeque;
        end = uVar8 >> 1;
        local_48.grainSize = 1;
        uVar6 = ((tg.workerDeque)->ownerData).head;
        uVar10 = (ulong)uVar6;
        local_48.split = end;
        local_48.end = uVar8;
        local_48.f = (anon_class_32_4_8f8caa33 *)local_68;
        if (uVar10 < 0x2000) {
          uVar12 = (uint32_t)(uVar10 + 1);
          ((tg.workerDeque)->ownerData).head = uVar12;
          ((tg.workerDeque)->taskArray)._M_elems[uVar10].metadata.stealer.
          super___atomic_base<unsigned_long>._M_i = 0;
          *(undefined ***)((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData =
               &PTR_operator___004334b8;
          *(anon_class_32_4_8f8caa33 **)
           (((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0x18) =
               (anon_class_32_4_8f8caa33 *)local_68;
          pcVar5 = ((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData;
          *(ulong *)(pcVar5 + 8) = CONCAT44(uVar8,end);
          *(ulong *)(pcVar5 + 0x10) = CONCAT44(local_48._12_4_,1);
          if (((tg.workerDeque)->ownerData).allStolenCopy == true) {
            ((tg.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                 uVar10 << 0x20 | uVar10 + 1;
            ((tg.workerDeque)->stealerData).allStolen._M_base._M_i = false;
            ((tg.workerDeque)->ownerData).splitCopy = uVar12;
            ((tg.workerDeque)->ownerData).allStolenCopy = false;
            if ((((tg.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
              ((tg.workerDeque)->splitRequest)._M_base._M_i = false;
            }
            peVar2 = ((tg.workerDeque)->ownerData).workerBunk.
                     super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            LOCK();
            _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
            (peVar2->haveJobs).super___atomic_base<int>._M_i =
                 (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (_Var1._M_i < ((tg.workerDeque)->ownerData).numWorkers + -1) {
              HighsSplitDeque::WorkerBunk::publishWork
                        (((tg.workerDeque)->ownerData).workerBunk.
                         super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,tg.workerDeque);
            }
          }
          else {
            HighsSplitDeque::growShared(tg.workerDeque);
          }
        }
        else {
          if ((((tg.workerDeque)->ownerData).splitCopy < 0x2000) &&
             (((tg.workerDeque)->ownerData).allStolenCopy == false)) {
            HighsSplitDeque::growShared(tg.workerDeque);
            uVar6 = (pHVar9->ownerData).head;
          }
          (pHVar9->ownerData).head = uVar6 + 1;
          HighsTask::
          Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/parallel/HighsParallel.h:118:16)>
          ::anon_class_24_4_3f80b2e7_for_functor::operator()(&local_48);
        }
        bVar4 = 3 < uVar8;
        uVar8 = end;
      } while (bVar4);
      chooseColumnSlice::anon_class_32_4_b1b9b1f6::operator()
                ((anon_class_32_4_b1b9b1f6 *)local_68,0,end);
      ::highs::parallel::TaskGroup::taskWait(&tg);
      ::highs::parallel::TaskGroup::~TaskGroup(&tg);
    }
    ::highs::parallel::sync();
    if (this->analysis->analyse_simplex_summary_data == true) {
      uVar11 = 0;
      uVar10 = (ulong)(uint)this->slice_num;
      if (this->slice_num < 1) {
        uVar10 = uVar11;
      }
      result_count = 0;
      for (; uVar10 * 0xb0 - uVar11 != 0; uVar11 = uVar11 + 0xb0) {
        result_count = result_count + *(int *)((long)&this->slice_row_ap[0].count + uVar11);
      }
      HighsSimplexAnalysis::operationRecordAfter(this->analysis,5,result_count);
    }
    lVar14 = 0;
    for (lVar13 = 0; lVar13 < this->slice_num; lVar13 = lVar13 + 1) {
      HEkkDualRow::chooseJoinpack
                (this_00,(HEkkDualRow *)
                         ((long)&((this->slice_dualRow).
                                  super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ekk_instance_ + lVar14)
                );
      lVar14 = lVar14 + 0x150;
    }
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2f,0);
    this->variable_in = -1;
    if (((this->dualRow).workTheta <= 0.0) || ((this->dualRow).workCount == 0)) {
      this->rebuild_reason = 6;
    }
    else {
      HVar7 = HEkkDualRow::chooseFinal(this_00);
      if (HVar7 == 0) {
        if ((this->slice_num == 0) &&
           (uVar8 = HEkkDualRow::debugChooseColumnInfeasibilities(this_00), uVar8 != 0)) {
          highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kError,
                      "chooseFinal would create %d dual infeasibilities\n",(ulong)uVar8);
          HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x38,0);
          this->rebuild_reason = 9;
          return;
        }
        HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3a,0);
        HEkkDualRow::deleteFreemove(this_00);
        HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3a,0);
        this->variable_in = (this->dualRow).workPivot;
        this->alpha_row = (this->dualRow).workAlpha;
        this->theta_dual = (this->dualRow).workTheta;
        if ((this->edge_weight_mode == kDevex) && (this->new_devex_framework == false)) {
          lVar14 = 0;
          HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3b,0);
          HEkkDualRow::computeDevexWeight(this_00,-1);
          for (lVar13 = 0; uVar8 = this->slice_num, lVar13 < (int)uVar8; lVar13 = lVar13 + 1) {
            HEkkDualRow::computeDevexWeight
                      ((HEkkDualRow *)
                       ((long)&((this->slice_dualRow).
                                super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>.
                                _M_impl.super__Vector_impl_data._M_start)->ekk_instance_ + lVar14),
                       (HighsInt)lVar13);
            lVar14 = lVar14 + 0x150;
          }
          dVar15 = (this->dualRow).computed_edge_weight;
          this->computed_edge_weight = dVar15;
          pHVar3 = (this->slice_dualRow).
                   super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = 0;
          uVar10 = (ulong)uVar8;
          if ((int)uVar8 < 1) {
            uVar10 = uVar11;
          }
          for (; uVar10 * 0x150 - uVar11 != 0; uVar11 = uVar11 + 0x150) {
            dVar15 = dVar15 + *(double *)((long)&pHVar3->computed_edge_weight + uVar11);
            this->computed_edge_weight = dVar15;
          }
          if (dVar15 <= 1.0) {
            dVar15 = 1.0;
          }
          this->computed_edge_weight = dVar15;
          HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3b,0);
        }
      }
      else {
        this->rebuild_reason = (HVar7 >> 0x1f) * -3 + 6;
      }
    }
  }
  return;
}

Assistant:

void HEkkDual::chooseColumnSlice(HVector* row_ep) {
  // Choose the index of a column to enter the basis (CHUZC) by
  // exploiting slices of the pivotal row - for SIP and PAMI
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;

  analysis->simplexTimerStart(Chuzc0Clock);
  dualRow.clear();
  dualRow.workDelta = delta_primal;
  dualRow.createFreemove(row_ep);
  analysis->simplexTimerStop(Chuzc0Clock);

  //  const HighsInt solver_num_row = ekk_instance_.lp_.num_row_;
  const double local_density = 1.0 * row_ep->count * inv_solver_num_row;
  bool use_col_price;
  bool use_row_price_w_switch;
  HighsSimplexInfo& info = ekk_instance_.info_;
  ekk_instance_.choosePriceTechnique(info.price_strategy, local_density,
                                     use_col_price, use_row_price_w_switch);

  if (analysis->analyse_simplex_summary_data) {
    const HighsInt row_ep_count = row_ep->count;
    if (use_col_price) {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count, 0.0);
      analysis->num_col_price++;
    } else if (use_row_price_w_switch) {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count,
                                      ekk_instance_.info_.row_ep_density);
      analysis->num_row_price_with_switch++;
    } else {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count,
                                      ekk_instance_.info_.row_ep_density);
      analysis->num_row_price++;
    }
  }
  analysis->simplexTimerStart(PriceChuzc1Clock);
  // Row_ep:         PACK + CC1

  highs::parallel::spawn([&]() {
    dualRow.chooseMakepack(row_ep, solver_num_col);
    dualRow.choosePossible();
  });

  // Row_ap: PRICE + PACK + CC1
  highs::parallel::for_each(0, slice_num, [&](HighsInt start, HighsInt end) {
    const bool quad_precision = false;
    for (HighsInt i = start; i < end; i++) {
      slice_row_ap[i].clear();

      if (use_col_price) {
        // Perform column-wise PRICE
        slice_a_matrix[i].priceByColumn(quad_precision, slice_row_ap[i],
                                        *row_ep);
      } else if (use_row_price_w_switch) {
        // Perform hyper-sparse row-wise PRICE, but switch if the density of
        // row_ap becomes extreme
        slice_ar_matrix[i].priceByRowWithSwitch(
            quad_precision, slice_row_ap[i], *row_ep,
            ekk_instance_.info_.row_ap_density, 0, kHyperPriceDensity);
      } else {
        // Perform hyper-sparse row-wise PRICE
        slice_ar_matrix[i].priceByRow(quad_precision, slice_row_ap[i], *row_ep);
      }

      slice_dualRow[i].clear();
      slice_dualRow[i].workDelta = delta_primal;
      slice_dualRow[i].chooseMakepack(&slice_row_ap[i], slice_start[i]);
      slice_dualRow[i].choosePossible();
    }
  });

  highs::parallel::sync();

  if (analysis->analyse_simplex_summary_data) {
    // Determine the nonzero count of the whole row
    HighsInt row_ap_count = 0;
    for (HighsInt i = 0; i < slice_num; i++)
      row_ap_count += slice_row_ap[i].count;
    analysis->operationRecordAfter(kSimplexNlaPriceAp, row_ap_count);
  }

  // Join CC1 results here
  for (HighsInt i = 0; i < slice_num; i++) {
    dualRow.chooseJoinpack(&slice_dualRow[i]);
  }

  analysis->simplexTimerStop(PriceChuzc1Clock);

  // Infeasible we created before
  variable_in = -1;
  if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
    rebuild_reason = kRebuildReasonPossiblyDualUnbounded;
    return;
  }

  // Choose column 2, This only happens if didn't go out
  HighsInt return_code = dualRow.chooseFinal();
  if (return_code) {
    // Only returns -1, if not zero
    assert(return_code == -1);
    if (return_code < 0) {
      rebuild_reason = kRebuildReasonChooseColumnFail;
    } else {
      rebuild_reason = kRebuildReasonPossiblyDualUnbounded;
    }
    return;
  }

  if (slice_num == 0) {
    // This check is only done for serial code - since packIndex/Value
    // is distributed
    HighsInt num_infeasibility = dualRow.debugChooseColumnInfeasibilities();
    if (num_infeasibility) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                  "chooseFinal would create %d dual infeasibilities\n",
                  (int)num_infeasibility);
      analysis->simplexTimerStop(Chuzc4dClock);
      rebuild_reason = kRebuildReasonChooseColumnFail;
      return;
    }
  }

  analysis->simplexTimerStart(Chuzc5Clock);
  dualRow.deleteFreemove();
  analysis->simplexTimerStop(Chuzc5Clock);

  variable_in = dualRow.workPivot;
  alpha_row = dualRow.workAlpha;
  theta_dual = dualRow.workTheta;

  if (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework) {
    // When using Devex, unless a new framework is to be used, get the
    // exact weight for the pivotal row and, based on its accuracy,
    // determine that a new framework is to be used. In serial
    // new_devex_framework should only ever be false at this point in
    // this method, but in PAMI, this method may be called multiple
    // times in minor iterations and the new framework is set up in
    // majorUpdate.
    analysis->simplexTimerStart(DevexWtClock);
    // Determine the partial sums of the exact Devex weight
    // First the partial sum for row_ep
    dualRow.computeDevexWeight();
    // Second the partial sums for the slices of row_ap
    for (HighsInt i = 0; i < slice_num; i++)
      slice_dualRow[i].computeDevexWeight(i);
    // Accumulate the partial sums
    // Initialise with the partial sum for row_ep
    computed_edge_weight = dualRow.computed_edge_weight;
    // Update with the partial sum for row_ep
    for (HighsInt i = 0; i < slice_num; i++)
      computed_edge_weight += slice_dualRow[i].computed_edge_weight;
    computed_edge_weight = max(1.0, computed_edge_weight);
    analysis->simplexTimerStop(DevexWtClock);
  }
}